

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTDiagMap.cpp
# Opt level: O3

Diagnostic * __thiscall slang::ast::ASTDiagMap::add(ASTDiagMap *this,Diagnostic *diag,bool *isNew)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  bool *pbVar6;
  ulong pos0;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  ulong hash;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  value_type_pointer ppVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  try_emplace_args_t local_a1;
  bool *local_a0;
  tuple<slang::DiagCode,_slang::SourceLocation> local_98;
  undefined1 local_88 [16];
  pointer local_78;
  ulong local_68;
  size_t seed;
  value_type_pointer local_50;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_98.super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
  super__Tuple_impl<1UL,_slang::SourceLocation>.super__Head_base<1UL,_slang::SourceLocation,_false>.
  _M_head_impl = *(_Head_base<1UL,_slang::SourceLocation,_false> *)&diag->location;
  local_98.super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
  super__Head_base<0UL,_slang::DiagCode,_false>._M_head_impl = diag->code;
  local_78 = (pointer)0x0;
  local_88 = (undefined1  [16])0x0;
  seed = 0;
  slang::detail::hashing::HashValueImpl<std::tuple<slang::DiagCode,_slang::SourceLocation>,_1UL>::
  apply(&seed,&local_98);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = seed;
  hash = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar5,8) ^
         SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar5,0);
  pos0 = hash >> ((byte)(this->map).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar13 = (this->map).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
            .arrays.elements_;
  local_68 = (this->map).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
             .arrays.groups_size_mask;
  uVar12 = 0;
  uVar9 = pos0;
  do {
    pgVar2 = (this->map).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
             .arrays.groups_ + uVar9;
    local_48 = pgVar2->m[0].n;
    uStack_47 = pgVar2->m[1].n;
    uStack_46 = pgVar2->m[2].n;
    bStack_45 = pgVar2->m[3].n;
    uStack_44 = pgVar2->m[4].n;
    uStack_43 = pgVar2->m[5].n;
    uStack_42 = pgVar2->m[6].n;
    bStack_41 = pgVar2->m[7].n;
    uStack_40 = pgVar2->m[8].n;
    uStack_3f = pgVar2->m[9].n;
    uStack_3e = pgVar2->m[10].n;
    bStack_3d = pgVar2->m[0xb].n;
    uStack_3c = pgVar2->m[0xc].n;
    uStack_3b = pgVar2->m[0xd].n;
    uStack_3a = pgVar2->m[0xe].n;
    bStack_39 = pgVar2->m[0xf].n;
    uVar14 = (uchar)uVar3;
    auVar18[0] = -(local_48 == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 8);
    auVar18[1] = -(uStack_47 == uVar15);
    uVar16 = (uchar)((uint)uVar3 >> 0x10);
    auVar18[2] = -(uStack_46 == uVar16);
    bVar17 = (byte)((uint)uVar3 >> 0x18);
    auVar18[3] = -(bStack_45 == bVar17);
    auVar18[4] = -(uStack_44 == uVar14);
    auVar18[5] = -(uStack_43 == uVar15);
    auVar18[6] = -(uStack_42 == uVar16);
    auVar18[7] = -(bStack_41 == bVar17);
    auVar18[8] = -(uStack_40 == uVar14);
    auVar18[9] = -(uStack_3f == uVar15);
    auVar18[10] = -(uStack_3e == uVar16);
    auVar18[0xb] = -(bStack_3d == bVar17);
    auVar18[0xc] = -(uStack_3c == uVar14);
    auVar18[0xd] = -(uStack_3b == uVar15);
    auVar18[0xe] = -(uStack_3a == uVar16);
    auVar18[0xf] = -(bStack_39 == bVar17);
    for (uVar10 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe); local_a0 = isNew,
        uVar10 != 0; uVar10 = uVar10 - 1 & uVar10) {
      uVar4 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar11 = (ulong)uVar4;
      if ((local_98.super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
           super__Head_base<0UL,_slang::DiagCode,_false>._M_head_impl ==
           ppVar13[uVar9 * 0xf + uVar11].first.
           super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
           super__Head_base<0UL,_slang::DiagCode,_false>._M_head_impl) &&
         (local_98.super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
          super__Tuple_impl<1UL,_slang::SourceLocation>.
          super__Head_base<1UL,_slang::SourceLocation,_false>._M_head_impl ==
          (_Head_base<1UL,_slang::SourceLocation,_false>)
          ppVar13[uVar9 * 0xf + uVar11].first.
          super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
          super__Tuple_impl<1UL,_slang::SourceLocation>.
          super__Head_base<1UL,_slang::SourceLocation,_false>._M_head_impl)) {
        ppVar13 = ppVar13 + uVar9 * 0xf + uVar11;
        bVar7 = false;
        goto LAB_0045a714;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
    lVar8 = uVar9 + uVar12;
    uVar12 = uVar12 + 1;
    uVar9 = lVar8 + 1U & local_68;
  } while (uVar12 <= local_68);
  if ((this->map).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
      .size_ctrl.size <
      (this->map).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>
              ((locator *)&seed,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
                *)this,(arrays_type *)this,pos0,hash,&local_a1,&local_98,
               (vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)local_88);
    psVar1 = &(this->map).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>
              ((locator *)&seed,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
                *)this,hash,&local_a1,&local_98,
               (vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)local_88);
  }
  bVar7 = true;
  ppVar13 = local_50;
LAB_0045a714:
  pbVar6 = local_a0;
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector
            ((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)local_88);
  *pbVar6 = bVar7;
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::
  emplace_back<slang::Diagnostic>(&ppVar13->second,diag);
  return (ppVar13->second).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
}

Assistant:

Diagnostic& ASTDiagMap::add(Diagnostic diag, bool& isNew) {
    auto [it, inserted] = map.try_emplace({diag.code, diag.location}, std::vector<Diagnostic>{});
    isNew = inserted;
    it->second.emplace_back(std::move(diag));
    return it->second.back();
}